

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O2

OPJ_BOOL opj_j2k_write_sod(opj_j2k_t *p_j2k,opj_tcd_t *p_tile_coder,OPJ_BYTE *p_data,
                          OPJ_UINT32 *p_data_written,OPJ_UINT32 total_data_size,
                          opj_stream_private_t *p_stream,opj_event_mgr_t *p_manager)

{
  OPJ_UINT32 *pOVar1;
  OPJ_UINT32 OVar2;
  undefined8 uVar3;
  uint *puVar4;
  opj_j2k_t *poVar5;
  char cVar6;
  OPJ_BOOL OVar7;
  uint uVar8;
  opj_tcd_marker_info_t *p_marker_info;
  char *pcVar9;
  uint uVar10;
  long lVar11;
  OPJ_BYTE *pOVar12;
  OPJ_BYTE *pOVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  byte bVar17;
  byte local_6d [5];
  OPJ_BYTE *local_68;
  OPJ_BYTE *local_60;
  undefined8 local_58;
  uint *local_50;
  OPJ_BYTE *local_48;
  opj_j2k_t *local_40;
  ulong local_38;
  
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x12ba,
                  "OPJ_BOOL opj_j2k_write_sod(opj_j2k_t *, opj_tcd_t *, OPJ_BYTE *, OPJ_UINT32 *, OPJ_UINT32, const opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (p_manager == (opj_event_mgr_t *)0x0) {
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x12bb,
                  "OPJ_BOOL opj_j2k_write_sod(opj_j2k_t *, opj_tcd_t *, OPJ_BYTE *, OPJ_UINT32 *, OPJ_UINT32, const opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (p_stream == (opj_stream_private_t *)0x0) {
    __assert_fail("p_stream != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x12bc,
                  "OPJ_BOOL opj_j2k_write_sod(opj_j2k_t *, opj_tcd_t *, OPJ_BYTE *, OPJ_UINT32 *, OPJ_UINT32, const opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (total_data_size < 4) {
    pcVar9 = "Not enough bytes in output buffer to write SOD marker\n";
LAB_0011eb4c:
    opj_event_msg(p_manager,1,pcVar9);
    return 0;
  }
  opj_write_bytes_LE(p_data,0xff93,2);
  p_tile_coder->tp_num = (p_j2k->m_specific_param).m_decoder.m_state;
  OVar2 = (p_j2k->m_specific_param).m_encoder.m_current_tile_part_number;
  p_tile_coder->cur_tp_num = OVar2;
  if (OVar2 == 0) {
    p_tile_coder->tcd_image->tiles->packno = 0;
  }
  *p_data_written = 0;
  OVar7 = (p_j2k->m_specific_param).m_encoder.m_PLT;
  if (OVar7 == 0) {
    p_marker_info = (opj_tcd_marker_info_t *)0x0;
  }
  else {
    p_marker_info = opj_tcd_marker_info_create(OVar7);
    if (p_marker_info == (opj_tcd_marker_info_t *)0x0) {
      pcVar9 = "Cannot encode tile: opj_tcd_marker_info_create() failed\n";
      goto LAB_0011eb4c;
    }
  }
  pOVar1 = &(p_j2k->m_specific_param).m_encoder.m_reserved_bytes_for_PLT;
  if (total_data_size - 4 < *pOVar1) {
    pcVar9 = "Not enough bytes in output buffer to write SOD marker\n";
  }
  else {
    local_48 = p_data;
    OVar7 = opj_tcd_encode_tile(p_tile_coder,p_j2k->m_current_tile_number,p_data + 2,p_data_written,
                                (total_data_size - 4) - *pOVar1,(opj_codestream_info_t *)0x0,
                                p_marker_info,p_manager);
    if (OVar7 != 0) {
      *p_data_written = *p_data_written + 2;
      if ((p_j2k->m_specific_param).m_encoder.m_PLT == 0) {
LAB_0011ee06:
        opj_tcd_marker_info_destroy(p_marker_info);
        return 1;
      }
      local_60 = (OPJ_BYTE *)
                 opj_malloc((ulong)(p_j2k->m_specific_param).m_encoder.m_reserved_bytes_for_PLT);
      if (local_60 != (OPJ_BYTE *)0x0) {
        local_68 = local_60 + 2;
        local_50 = p_data_written;
        opj_write_bytes_LE(local_60,0xff58,2);
        opj_write_bytes_LE(local_60 + 4,0,1);
        pOVar12 = local_60 + 5;
        uVar10 = 3;
        local_58 = 0;
        local_40 = p_j2k;
        uVar16 = 0;
        while (poVar5 = local_40, pOVar13 = local_60, uVar10 = uVar10 & 0xffff,
              uVar16 < p_marker_info->packet_count) {
          uVar8 = p_marker_info->p_packet_size[uVar16];
          local_6d[0] = (byte)uVar8 & 0x7f;
          uVar14 = 0;
          lVar11 = 1;
          while (uVar3 = local_58, 0x7f < uVar8) {
            uVar8 = uVar8 >> 7;
            local_6d[lVar11] = (byte)uVar8 | 0x80;
            lVar11 = lVar11 + 1;
            uVar14 = uVar14 + 1;
          }
          local_38 = uVar16;
          pOVar13 = pOVar12;
          if (0xffff < (int)lVar11 + uVar10) {
            cVar6 = (char)local_58;
            if (cVar6 == -1) {
              opj_event_msg(p_manager,1,
                            "More than 255 PLT markers would be needed for current tile-part !\n");
              opj_tcd_marker_info_destroy(p_marker_info);
              opj_free(local_60);
              return 0;
            }
            opj_write_bytes_LE(local_68,uVar10,2);
            opj_write_bytes_LE(pOVar12,0xff58,2);
            local_68 = pOVar12 + 2;
            bVar17 = cVar6 + 1;
            local_58 = CONCAT71((int7)((ulong)uVar3 >> 8),bVar17);
            opj_write_bytes_LE(pOVar12 + 4,(uint)bVar17,1);
            pOVar13 = pOVar12 + 5;
            uVar10 = 3;
          }
          for (lVar15 = 0; pOVar12 = pOVar13 + lVar15, lVar11 != lVar15; lVar15 = lVar15 + 1) {
            opj_write_bytes_LE(pOVar12,(uint)local_6d[uVar14 & 0xffffffff],1);
            uVar14 = uVar14 - 1;
          }
          uVar10 = (int)lVar11 + uVar10;
          uVar16 = local_38 + 1;
        }
        uVar16 = (long)pOVar12 - (long)local_60;
        opj_write_bytes_LE(local_68,uVar10,2);
        pOVar12 = local_48;
        puVar4 = local_50;
        uVar10 = (uint)uVar16;
        if ((poVar5->m_specific_param).m_encoder.m_reserved_bytes_for_PLT < uVar10) {
          __assert_fail("l_data_written_PLT <= p_j2k->m_specific_param.m_encoder.m_reserved_bytes_for_PLT"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                        ,0x132d,
                        "OPJ_BOOL opj_j2k_write_sod(opj_j2k_t *, opj_tcd_t *, OPJ_BYTE *, OPJ_UINT32 *, OPJ_UINT32, const opj_stream_private_t *, opj_event_mgr_t *)"
                       );
        }
        uVar16 = uVar16 & 0xffffffff;
        memmove(local_48 + uVar16,local_48,(ulong)*local_50);
        memcpy(pOVar12,pOVar13,uVar16);
        opj_free(pOVar13);
        *puVar4 = *puVar4 + uVar10;
        goto LAB_0011ee06;
      }
      opj_event_msg(p_manager,1,"Cannot allocate memory\n");
      goto LAB_0011edaa;
    }
    pcVar9 = "Cannot encode tile\n";
  }
  opj_event_msg(p_manager,1,pcVar9);
LAB_0011edaa:
  opj_tcd_marker_info_destroy(p_marker_info);
  return 0;
}

Assistant:

static OPJ_BOOL opj_j2k_write_sod(opj_j2k_t *p_j2k,
                                  opj_tcd_t * p_tile_coder,
                                  OPJ_BYTE * p_data,
                                  OPJ_UINT32 * p_data_written,
                                  OPJ_UINT32 total_data_size,
                                  const opj_stream_private_t *p_stream,
                                  opj_event_mgr_t * p_manager
                                 )
{
    opj_codestream_info_t *l_cstr_info = 00;
    OPJ_UINT32 l_remaining_data;
    opj_tcd_marker_info_t* marker_info = NULL;

    /* preconditions */
    assert(p_j2k != 00);
    assert(p_manager != 00);
    assert(p_stream != 00);

    OPJ_UNUSED(p_stream);

    if (total_data_size < 4) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Not enough bytes in output buffer to write SOD marker\n");
        return OPJ_FALSE;
    }

    opj_write_bytes(p_data, J2K_MS_SOD,
                    2);                                 /* SOD */

    /* make room for the EOF marker */
    l_remaining_data =  total_data_size - 4;

    /* update tile coder */
    p_tile_coder->tp_num =
        p_j2k->m_specific_param.m_encoder.m_current_poc_tile_part_number ;
    p_tile_coder->cur_tp_num =
        p_j2k->m_specific_param.m_encoder.m_current_tile_part_number;

    /* INDEX >> */
    /* TODO mergeV2: check this part which use cstr_info */
    /*l_cstr_info = p_j2k->cstr_info;
    if (l_cstr_info) {
            if (!p_j2k->m_specific_param.m_encoder.m_current_tile_part_number ) {
                    //TODO cstr_info->tile[p_j2k->m_current_tile_number].end_header = p_stream_tell(p_stream) + p_j2k->pos_correction - 1;
                    l_cstr_info->tile[p_j2k->m_current_tile_number].tileno = p_j2k->m_current_tile_number;
            }
            else {*/
    /*
    TODO
    if
            (cstr_info->tile[p_j2k->m_current_tile_number].packet[cstr_info->packno - 1].end_pos < p_stream_tell(p_stream))
    {
            cstr_info->tile[p_j2k->m_current_tile_number].packet[cstr_info->packno].start_pos = p_stream_tell(p_stream);
    }*/
    /*}*/
    /* UniPG>> */
#ifdef USE_JPWL
    /* update markers struct */
    /*OPJ_BOOL res = j2k_add_marker(p_j2k->cstr_info, J2K_MS_SOD, p_j2k->sod_start, 2);
    */
    assert(0 && "TODO");
#endif /* USE_JPWL */
    /* <<UniPG */
    /*}*/
    /* << INDEX */

    if (p_j2k->m_specific_param.m_encoder.m_current_tile_part_number == 0) {
        p_tile_coder->tcd_image->tiles->packno = 0;
#ifdef deadcode
        if (l_cstr_info) {
            l_cstr_info->packno = 0;
        }
#endif
    }

    *p_data_written = 0;

    if (p_j2k->m_specific_param.m_encoder.m_PLT) {
        marker_info = opj_tcd_marker_info_create(
                          p_j2k->m_specific_param.m_encoder.m_PLT);
        if (marker_info == NULL) {
            opj_event_msg(p_manager, EVT_ERROR,
                          "Cannot encode tile: opj_tcd_marker_info_create() failed\n");
            return OPJ_FALSE;
        }
    }

    if (l_remaining_data <
            p_j2k->m_specific_param.m_encoder.m_reserved_bytes_for_PLT) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Not enough bytes in output buffer to write SOD marker\n");
        opj_tcd_marker_info_destroy(marker_info);
        return OPJ_FALSE;
    }
    l_remaining_data -= p_j2k->m_specific_param.m_encoder.m_reserved_bytes_for_PLT;

    if (! opj_tcd_encode_tile(p_tile_coder, p_j2k->m_current_tile_number,
                              p_data + 2,
                              p_data_written, l_remaining_data, l_cstr_info,
                              marker_info,
                              p_manager)) {
        opj_event_msg(p_manager, EVT_ERROR, "Cannot encode tile\n");
        opj_tcd_marker_info_destroy(marker_info);
        return OPJ_FALSE;
    }

    /* For SOD */
    *p_data_written += 2;

    if (p_j2k->m_specific_param.m_encoder.m_PLT) {
        OPJ_UINT32 l_data_written_PLT = 0;
        OPJ_BYTE* p_PLT_buffer = (OPJ_BYTE*)opj_malloc(
                                     p_j2k->m_specific_param.m_encoder.m_reserved_bytes_for_PLT);
        if (!p_PLT_buffer) {
            opj_event_msg(p_manager, EVT_ERROR, "Cannot allocate memory\n");
            opj_tcd_marker_info_destroy(marker_info);
            return OPJ_FALSE;
        }
        if (!opj_j2k_write_plt_in_memory(p_j2k,
                                         marker_info,
                                         p_PLT_buffer,
                                         &l_data_written_PLT,
                                         p_manager)) {
            opj_tcd_marker_info_destroy(marker_info);
            opj_free(p_PLT_buffer);
            return OPJ_FALSE;
        }

        assert(l_data_written_PLT <=
               p_j2k->m_specific_param.m_encoder.m_reserved_bytes_for_PLT);

        /* Move PLT marker(s) before SOD */
        memmove(p_data + l_data_written_PLT, p_data, *p_data_written);
        memcpy(p_data, p_PLT_buffer, l_data_written_PLT);
        opj_free(p_PLT_buffer);
        *p_data_written += l_data_written_PLT;
    }

    opj_tcd_marker_info_destroy(marker_info);

    return OPJ_TRUE;
}